

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_30;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_28;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *local_20;
  buffer_appender<char> *it;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *paStack_10;
  char value_local;
  arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
  *this_local;
  
  it._7_1_ = (undefined1)__fd;
  paStack_10 = this;
  local_28.container = (buffer<char> *)reserve(this,1);
  local_20 = &local_28;
  local_30.container =
       (buffer<char> *)buffer_appender<char>::operator++((buffer_appender<char> *)local_20,0);
  pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator*(&local_30);
  pbVar1 = std::back_insert_iterator<fmt::v7::detail::buffer<char>_>::operator=
                     (pbVar1,(value_type_conflict4 *)((long)&it + 7));
  return (ssize_t)pbVar1;
}

Assistant:

void write(char value) {
    auto&& it = reserve(1);
    *it++ = value;
  }